

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int lws_get_addresses(lws_vhost *vh,void *ads,char *name,int name_len,char *rip,int rip_len)

{
  int iVar1;
  char *pcVar2;
  uchar local_90 [8];
  addrinfo *result;
  sockaddr_in addr4;
  addrinfo *res;
  addrinfo ai;
  int rip_len_local;
  char *rip_local;
  int name_len_local;
  char *name_local;
  void *ads_local;
  lws_vhost *vh_local;
  
  *rip = '\0';
  *name = '\0';
  result._0_2_ = 0;
  ai.ai_next._4_4_ = rip_len;
  memset(&res,0,0x30);
  res._4_4_ = 0;
  ai.ai_flags = 1;
  iVar1 = getnameinfo((sockaddr *)ads,0x10,name,name_len,(char *)0x0,0,0);
  if (iVar1 == 0) {
    iVar1 = getaddrinfo(name,(char *)0x0,(addrinfo *)&res,(addrinfo **)local_90);
    if (iVar1 == 0) {
      addr4.sin_zero[0] = local_90[0];
      addr4.sin_zero[1] = local_90[1];
      addr4.sin_zero[2] = local_90[2];
      addr4.sin_zero[3] = local_90[3];
      addr4.sin_zero[4] = local_90[4];
      addr4.sin_zero[5] = local_90[5];
      addr4.sin_zero[6] = local_90[6];
      addr4.sin_zero[7] = local_90[7];
      for (; (short)result == 0 && addr4.sin_zero != (uchar  [8])0x0;
          addr4.sin_zero = *(uchar (*) [8])((long)addr4.sin_zero + 0x28)) {
        if (*(int *)((long)addr4.sin_zero + 4) == 2) {
          result._4_4_ = *(undefined4 *)(*(long *)((long)addr4.sin_zero + 0x18) + 4);
          result._0_2_ = 2;
        }
      }
      freeaddrinfo((addrinfo *)local_90);
      if ((short)result == 0) {
        vh_local._4_4_ = -1;
      }
      else {
        pcVar2 = lws_plat_inet_ntop(2,(void *)((long)&result + 4),rip,ai.ai_next._4_4_);
        if (pcVar2 == (char *)0x0) {
          vh_local._4_4_ = -1;
        }
        else {
          vh_local._4_4_ = 0;
        }
      }
    }
    else {
      vh_local._4_4_ = -1;
    }
  }
  else {
    vh_local._4_4_ = -1;
  }
  return vh_local._4_4_;
}

Assistant:

static int
lws_get_addresses(struct lws_vhost *vh, void *ads, char *name,
		  int name_len, char *rip, int rip_len)
{
	struct addrinfo ai, *res;
	struct sockaddr_in addr4;

	rip[0] = '\0';
	name[0] = '\0';
	addr4.sin_family = AF_UNSPEC;

#ifdef LWS_WITH_IPV6
	if (LWS_IPV6_ENABLED(vh)) {
		if (!lws_plat_inet_ntop(AF_INET6,
					&((struct sockaddr_in6 *)ads)->sin6_addr,
					rip, (socklen_t)rip_len)) {
			lwsl_vhost_err(vh, "inet_ntop: %s", strerror(LWS_ERRNO));
			return -1;
		}

		// Strip off the IPv4 to IPv6 header if one exists
		if (strncmp(rip, "::ffff:", 7) == 0)
			memmove(rip, rip + 7, strlen(rip) - 6);

		getnameinfo((struct sockaddr *)ads, sizeof(struct sockaddr_in6),
			    name,
#if defined(__ANDROID__)
			    (size_t)name_len,
#else
			    (socklen_t)name_len,
#endif
			    NULL, 0, 0);

		return 0;
	} else
#endif
	{
		struct addrinfo *result;

		memset(&ai, 0, sizeof ai);
		ai.ai_family = PF_UNSPEC;
		ai.ai_socktype = SOCK_STREAM;
#if !defined(LWS_PLAT_FREERTOS)
		if (getnameinfo((struct sockaddr *)ads,
				sizeof(struct sockaddr_in),
				name,
#if defined(__ANDROID__)
				(size_t)name_len,
#else
				(socklen_t)name_len,
#endif
				NULL, 0, 0))
			return -1;
#endif

		if (getaddrinfo(name, NULL, &ai, &result))
			return -1;

		res = result;
		while (addr4.sin_family == AF_UNSPEC && res) {
			switch (res->ai_family) {
			case AF_INET:
				addr4.sin_addr =
				 ((struct sockaddr_in *)res->ai_addr)->sin_addr;
				addr4.sin_family = AF_INET;
				break;
			}

			res = res->ai_next;
		}
		freeaddrinfo(result);
	}

	if (addr4.sin_family == AF_UNSPEC)
		return -1;

	if (lws_plat_inet_ntop(AF_INET, &addr4.sin_addr, rip,
			       (socklen_t)rip_len) == NULL)
		return -1;

	return 0;
}